

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_xu_index.c
# Opt level: O0

int dwarf_get_xu_section_offset
              (Dwarf_Xu_Index_Header xuhdr,Dwarf_Unsigned irow_index,Dwarf_Unsigned column_index,
              Dwarf_Unsigned *sec_offset,Dwarf_Unsigned *sec_size,Dwarf_Error *error)

{
  Dwarf_Debug dbg_00;
  Dwarf_Small *pDVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Byte_Ptr pDVar3;
  ulong v;
  char *pcVar4;
  Dwarf_Small *pDVar5;
  Dwarf_Small *pDVar6;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  dwarfstring s_2;
  dwarfstring s_1;
  dwarfstring s;
  Dwarf_Unsigned row_index;
  Dwarf_Small *section_end;
  Dwarf_Unsigned column_count;
  Dwarf_Unsigned size;
  Dwarf_Unsigned offset;
  Dwarf_Small *sizeentry;
  Dwarf_Small *offsetentry;
  Dwarf_Small *sizerow;
  Dwarf_Small *offsetrow;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *sec_size_local;
  Dwarf_Unsigned *sec_offset_local;
  Dwarf_Unsigned column_index_local;
  Dwarf_Unsigned irow_index_local;
  Dwarf_Xu_Index_Header xuhdr_local;
  
  v = irow_index - 1;
  if (xuhdr == (Dwarf_Xu_Index_Header)0x0) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x10c,
                        "DW_DLE_XU_TYPE_ARG_ERROR: Dwarf_Xu_Index_Header pointer is null");
    xuhdr_local._4_4_ = 1;
  }
  else {
    dbg_00 = xuhdr->gx_dbg;
    if ((dbg_00 == (Dwarf_Debug)0x0) || (dbg_00->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: dbg argument to dwarf_get_xu_section_offset()either null or it containsa stale Dwarf_Debug pointer"
                         );
      xuhdr_local._4_4_ = 1;
    }
    else {
      pDVar1 = xuhdr->gx_section_data;
      DVar2 = xuhdr->gx_section_length;
      if (irow_index == 0) {
        dwarfstring_constructor((dwarfstring_s *)&s_1.s_malloc);
        dwarfstring_append((dwarfstring_s *)&s_1.s_malloc,
                           "ERROR: DW_DLE_ERRONEOUS_XU_INDEX_SECTION The row index passed to dwarf_get_xu_section_offset() is zero, which is not a valid row in  the offset-table or the size table as we think of them as 1-origin."
                          );
        pcVar4 = dwarfstring_string((dwarfstring_s *)&s_1.s_malloc);
        _dwarf_error_string(dbg_00,error,0x10e,pcVar4);
        dwarfstring_destructor((dwarfstring_s *)&s_1.s_malloc);
        xuhdr_local._4_4_ = 1;
      }
      else if (v < xuhdr->gx_units_in_index) {
        if (column_index < xuhdr->gx_column_count_sections) {
          pDVar5 = xuhdr->gx_section_data +
                   column_index * 4 +
                   v * xuhdr->gx_column_count_sections * 4 + xuhdr->gx_section_offsets_offset;
          pDVar6 = xuhdr->gx_section_data +
                   column_index * 4 +
                   v * xuhdr->gx_column_count_sections * 4 + xuhdr->gx_section_sizes_offset;
          readend = (Dwarf_Byte_Ptr)0x0;
          _ltmp_1 = (Dwarf_Unsigned)(pDVar5 + 4);
          if (_ltmp_1 < pDVar5) {
            _dwarf_error_string(dbg_00,error,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                               );
            xuhdr_local._4_4_ = 1;
          }
          else if (pDVar1 + DVar2 < _ltmp_1) {
            _dwarf_error_string(dbg_00,error,0x14b,
                                "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                               );
            xuhdr_local._4_4_ = 1;
          }
          else {
            (*dbg_00->de_copy_word)(&readend,pDVar5,4);
            pDVar3 = readend;
            readend_1 = (Dwarf_Byte_Ptr)0x0;
            if (pDVar6 + 4 < pDVar6) {
              _dwarf_error_string(dbg_00,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                                 );
              xuhdr_local._4_4_ = 1;
            }
            else if (pDVar1 + DVar2 < pDVar6 + 4) {
              _dwarf_error_string(dbg_00,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                 );
              xuhdr_local._4_4_ = 1;
            }
            else {
              (*dbg_00->de_copy_word)(&readend_1,pDVar6,4);
              *sec_offset = (Dwarf_Unsigned)pDVar3;
              *sec_size = (Dwarf_Unsigned)readend_1;
              xuhdr_local._4_4_ = 0;
            }
          }
        }
        else {
          dwarfstring_constructor((dwarfstring_s *)&_ltmp);
          dwarfstring_append_printf_u
                    ((dwarfstring *)&_ltmp,
                     "ERROR: DW_DLE_XU_NAME_COL_ERROR as the column index of %u ",column_index);
          dwarfstring_append_printf_u
                    ((dwarfstring *)&_ltmp," is too high. Valid column indexes  must be < %u ",
                     xuhdr->gx_column_count_sections);
          pcVar4 = dwarfstring_string((dwarfstring_s *)&_ltmp);
          _dwarf_error_string(dbg_00,error,0x10e,pcVar4);
          dwarfstring_destructor((dwarfstring_s *)&_ltmp);
          xuhdr_local._4_4_ = 1;
        }
      }
      else {
        dwarfstring_constructor((dwarfstring_s *)&s_2.s_malloc);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&s_2.s_malloc,
                   "ERROR: DW_DLE_XU_NAME_COL_ERROR as the row index of %u ",v);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&s_2.s_malloc," is too high. Valid units must be < %u ",
                   xuhdr->gx_units_in_index);
        pcVar4 = dwarfstring_string((dwarfstring_s *)&s_2.s_malloc);
        _dwarf_error_string(dbg_00,error,0x10e,pcVar4);
        dwarfstring_destructor((dwarfstring_s *)&s_2.s_malloc);
        xuhdr_local._4_4_ = 1;
      }
    }
  }
  return xuhdr_local._4_4_;
}

Assistant:

int
dwarf_get_xu_section_offset(Dwarf_Xu_Index_Header xuhdr,
    Dwarf_Unsigned  irow_index,
    Dwarf_Unsigned  column_index,
    Dwarf_Unsigned *sec_offset,
    Dwarf_Unsigned *sec_size,
    Dwarf_Error    *error)
{
    /* We use zero origin in the arrays, Users see
        one origin from the hash table. */
    Dwarf_Debug dbg = 0;
    /* get to base of tables first. */
    Dwarf_Small *offsetrow =  0;
    Dwarf_Small *sizerow =  0;
    Dwarf_Small *offsetentry = 0;
    Dwarf_Small *sizeentry =  0;
    Dwarf_Unsigned offset = 0;
    Dwarf_Unsigned size = 0;
    Dwarf_Unsigned column_count = 0;
    Dwarf_Small *section_end = 0;
    Dwarf_Unsigned row_index = irow_index-1;

    if (!xuhdr) {
        _dwarf_error_string(0,error,DW_DLE_XU_TYPE_ARG_ERROR,
            "DW_DLE_XU_TYPE_ARG_ERROR: "
            "Dwarf_Xu_Index_Header pointer is null");
        return DW_DLV_ERROR;
    }
/* FIXME */
    dbg = xuhdr->gx_dbg;
    CHECK_DBG(dbg,error,"dwarf_get_xu_section_offset()");
    sizerow =  xuhdr->gx_section_sizes_offset +
        xuhdr->gx_section_data;
    offsetrow =  xuhdr->gx_section_offsets_offset +
        xuhdr->gx_section_data;
    column_count = xuhdr->gx_column_count_sections;
    section_end = xuhdr->gx_section_data + xuhdr->gx_section_length;

    if (!irow_index) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append(&s,
            "ERROR: DW_DLE_ERRONEOUS_XU_INDEX_SECTION "
            "The row index passed to dwarf_get_xu_section_offset() "
            "is zero, which is not a valid row in "
            " the offset-table or the size table as we think"
            " of them as 1-origin.");
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }
    if (row_index >= xuhdr->gx_units_in_index) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u(&s,
            "ERROR: DW_DLE_XU_NAME_COL_ERROR as the "
            "row index of %u ",row_index);
        dwarfstring_append_printf_u(&s," is too high. "
            "Valid units must be < %u ",xuhdr->gx_units_in_index);
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }

    if (column_index >=  xuhdr->gx_column_count_sections) {
        dwarfstring s;

        dwarfstring_constructor(&s);
        dwarfstring_append_printf_u(&s,
            "ERROR: DW_DLE_XU_NAME_COL_ERROR as the "
            "column index of %u ",column_index);
        dwarfstring_append_printf_u(&s," is too high. "
            "Valid column indexes  must be < %u ",
            xuhdr->gx_column_count_sections);
        _dwarf_error_string(dbg, error, DW_DLE_XU_NAME_COL_ERROR,
            dwarfstring_string(&s));
        dwarfstring_destructor(&s);
        return DW_DLV_ERROR;
    }
    /*  As noted above we have hidden the extra initial
        row from the offsets table so it is just
        0 to U-1. */
    offsetrow = offsetrow + (row_index*column_count * SIZEOFT32);
    offsetentry = offsetrow + (column_index *  SIZEOFT32);

    sizerow = sizerow + (row_index*column_count * SIZEOFT32);
    sizeentry = sizerow + (column_index *  SIZEOFT32);

    {
        READ_UNALIGNED_CK(dbg,offset,Dwarf_Unsigned,
            offsetentry,
            SIZEOFT32,error,section_end);
        offsetentry += SIZEOFT32;

        READ_UNALIGNED_CK(dbg,size,Dwarf_Unsigned,
            sizeentry,
            SIZEOFT32,error,section_end);
        sizeentry += SIZEOFT32;
    }
    *sec_offset = offset;
    *sec_size =  size;
    return DW_DLV_OK;
}